

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprCodeTemp(Parse *pParse,Expr *pExpr,int *pReg)

{
  int iVar1;
  Expr *p;
  int local_24;
  int r1;
  int r2;
  int *pReg_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  p = sqlite3ExprSkipCollate(pExpr);
  if (((pParse->okConstFactor == '\0') || (p->op == 0xa8)) ||
     (iVar1 = sqlite3ExprIsConstantNotJoin(p), iVar1 == 0)) {
    iVar1 = sqlite3GetTempReg(pParse);
    local_24 = sqlite3ExprCodeTarget(pParse,p,iVar1);
    if (local_24 == iVar1) {
      *pReg = iVar1;
    }
    else {
      sqlite3ReleaseTempReg(pParse,iVar1);
      *pReg = 0;
    }
  }
  else {
    *pReg = 0;
    local_24 = sqlite3ExprCodeAtInit(pParse,p,-1);
  }
  return local_24;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeTemp(Parse *pParse, Expr *pExpr, int *pReg){
  int r2;
  pExpr = sqlite3ExprSkipCollate(pExpr);
  if( ConstFactorOk(pParse)
   && pExpr->op!=TK_REGISTER
   && sqlite3ExprIsConstantNotJoin(pExpr)
  ){
    *pReg  = 0;
    r2 = sqlite3ExprCodeAtInit(pParse, pExpr, -1);
  }else{
    int r1 = sqlite3GetTempReg(pParse);
    r2 = sqlite3ExprCodeTarget(pParse, pExpr, r1);
    if( r2==r1 ){
      *pReg = r1;
    }else{
      sqlite3ReleaseTempReg(pParse, r1);
      *pReg = 0;
    }
  }
  return r2;
}